

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::AppendTargetOutputs
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,cmNinjaDeps *outputs,
          cmNinjaTargetDepends depends)

{
  bool realname;
  TargetType TVar1;
  cmMakefile *this_00;
  string *psVar2;
  cmLocalGenerator *this_01;
  string path;
  string configName;
  allocator<char> local_a9;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  this_00 = cmTarget::GetMakefile(target->Target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"CMAKE_BUILD_TYPE",(allocator<char> *)&local_88);
  psVar2 = cmMakefile::GetSafeDefinition(this_00,&local_a8);
  std::__cxx11::string::string((string *)&local_48,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_a8);
  realname = cmGeneratorTarget::IsFrameworkOnApple(target);
  TVar1 = cmGeneratorTarget::GetType(target);
  switch(TVar1) {
  case EXECUTABLE:
switchD_00226005_caseD_0:
    cmGeneratorTarget::GetFullPath(&local_a8,target,&local_48,RuntimeBinaryArtifact,realname);
    psVar2 = ConvertToNinjaPath(this,&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(outputs,psVar2);
    break;
  case STATIC_LIBRARY:
  case SHARED_LIBRARY:
  case MODULE_LIBRARY:
    if (depends != DependOnTargetOrdering) goto switchD_00226005_caseD_0;
    OrderDependsTargetForTarget_abi_cxx11_(&local_a8,target);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)outputs,
               &local_a8);
    break;
  case OBJECT_LIBRARY:
    if (depends == DependOnTargetOrdering) {
      OrderDependsTargetForTarget_abi_cxx11_(&local_a8,target);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)outputs,
                 &local_a8);
      break;
    }
  case UTILITY:
  case GLOBAL_TARGET:
    this_01 = cmGeneratorTarget::GetLocalGenerator(target);
    psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_01);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"/",&local_a9);
    std::operator+(&local_88,psVar2,&local_68);
    psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    std::operator+(&local_a8,&local_88,psVar2);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    psVar2 = ConvertToNinjaPath(this,&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(outputs,psVar2);
    break;
  default:
    goto switchD_00226005_default;
  }
  std::__cxx11::string::~string((string *)&local_a8);
switchD_00226005_default:
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AppendTargetOutputs(
  cmGeneratorTarget const* target, cmNinjaDeps& outputs,
  cmNinjaTargetDepends depends)
{
  std::string configName =
    target->Target->GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE");

  // for frameworks, we want the real name, not smple name
  // frameworks always appear versioned, and the build.ninja
  // will always attempt to manage symbolic links instead
  // of letting cmOSXBundleGenerator do it.
  bool realname = target->IsFrameworkOnApple();

  switch (target->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY: {
      if (depends == DependOnTargetOrdering) {
        outputs.push_back(OrderDependsTargetForTarget(target));
        break;
      }
    }
    // FALLTHROUGH
    case cmStateEnums::EXECUTABLE: {
      outputs.push_back(this->ConvertToNinjaPath(target->GetFullPath(
        configName, cmStateEnums::RuntimeBinaryArtifact, realname)));
      break;
    }
    case cmStateEnums::OBJECT_LIBRARY: {
      if (depends == DependOnTargetOrdering) {
        outputs.push_back(OrderDependsTargetForTarget(target));
        break;
      }
    }
    // FALLTHROUGH
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::UTILITY: {
      std::string path =
        target->GetLocalGenerator()->GetCurrentBinaryDirectory() +
        std::string("/") + target->GetName();
      outputs.push_back(this->ConvertToNinjaPath(path));
      break;
    }

    default:
      return;
  }
}